

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O1

void despot::AEMS::Update(QNode *qnode)

{
  VNode *this;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *pmVar1;
  _Rb_tree_node_base *p_Var2;
  _Self __tmp;
  double dVar3;
  double dVar4;
  double dVar5;
  double value;
  
  dVar5 = qnode->step_reward;
  pmVar1 = QNode::children(qnode);
  value = dVar5;
  for (p_Var2 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    this = (VNode *)p_Var2[1]._M_parent;
    dVar3 = DAT_00193de8 * this->likelihood;
    dVar4 = VNode::lower_bound(this);
    dVar5 = dVar5 + dVar4 * dVar3;
    dVar3 = DAT_00193de8 * this->likelihood;
    dVar4 = VNode::upper_bound(this);
    value = value + dVar4 * dVar3;
  }
  dVar3 = QNode::lower_bound(qnode);
  if (dVar3 < dVar5) {
    QNode::lower_bound(qnode,dVar5);
  }
  dVar5 = QNode::upper_bound(qnode);
  if (value < dVar5) {
    QNode::upper_bound(qnode,value);
    return;
  }
  return;
}

Assistant:

void AEMS::Update(QNode* qnode) {
	double lower = qnode->step_reward;
	double upper = qnode->step_reward;

	map<OBS_TYPE, VNode*>& children = qnode->children();
	for (map<OBS_TYPE, VNode*>::iterator it = children.begin();
			it != children.end(); it++) {
		VNode* vnode = it->second;

		lower += Globals::Discount() * vnode->likelihood * vnode->lower_bound();
		upper += Globals::Discount() * vnode->likelihood * vnode->upper_bound();
	}

	if (lower > qnode->lower_bound())
		qnode->lower_bound(lower);
	if (upper < qnode->upper_bound())
		qnode->upper_bound(upper);
}